

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O2

base_learner * GD::setup(options_i *options,vw *all)

{
  element_type *peVar1;
  _func_float_gd_ptr_base_learner_ptr_example_ptr *p_Var2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  option_group_definition *poVar7;
  typed_option<float> *ptVar8;
  typed_option<double> *ptVar9;
  typed_option<unsigned_long> *ptVar10;
  element_type eVar11;
  ostream *poVar12;
  code *pcVar13;
  uint64_t uVar14;
  learner<GD::gd,_example> *plVar15;
  vw_exception *this;
  code *pcVar16;
  uint32_t *puVar17;
  code *pcVar18;
  bool bVar19;
  bool bVar20;
  float fVar21;
  double dVar22;
  bool normalized;
  bool invariant;
  bool adax;
  bool adaptive;
  bool sgd;
  allocator local_da8;
  allocator local_da7;
  allocator local_da6;
  allocator local_da5;
  allocator local_da4;
  allocator local_da3;
  allocator local_da2;
  allocator local_da1;
  allocator local_da0;
  allocator local_d9f;
  allocator local_d9e;
  allocator local_d9d;
  allocator local_d9c;
  allocator local_d9b;
  allocator local_d9a;
  allocator local_d99;
  free_ptr<GD::gd> g;
  string local_d88 [32];
  string local_d68;
  string local_d48 [32];
  string local_d28;
  string local_d08 [32];
  string local_ce8;
  string local_cc8 [32];
  string local_ca8;
  string local_c88 [32];
  string local_c68;
  string local_c48 [32];
  string local_c28;
  string local_c08 [32];
  string local_be8;
  string local_bc8 [32];
  string local_ba8;
  string local_b88;
  string local_b68;
  option_group_definition new_options;
  undefined1 local_b10 [160];
  stringstream __msg;
  undefined1 local_a60 [376];
  undefined1 local_8e8 [160];
  undefined1 local_848 [160];
  undefined1 local_7a8 [160];
  typed_option<double> local_708;
  typed_option<double> local_668;
  typed_option<double> local_5c8;
  typed_option<double> local_528;
  typed_option<float> local_488;
  typed_option<float> local_3e8;
  typed_option<bool> local_348;
  typed_option<bool> local_2a8;
  typed_option<bool> local_208;
  typed_option<bool> local_168;
  typed_option<bool> local_c8;
  
  scoped_calloc_or_throw<GD::gd>();
  sgd = false;
  adaptive = false;
  adax = false;
  invariant = false;
  normalized = false;
  std::__cxx11::string::string((string *)&local_b88,"Gradient Descent options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_b88);
  std::__cxx11::string::~string((string *)&local_b88);
  std::__cxx11::string::string((string *)&local_ba8,"sgd",&local_d99);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_ba8,&sgd);
  std::__cxx11::string::string
            (local_bc8,"use regular stochastic gradient descent update.",&local_d9a);
  std::__cxx11::string::_M_assign((string *)(local_a60 + 0x20));
  VW::config::typed_option<bool>::typed_option(&local_c8,(typed_option<bool> *)&__msg);
  poVar7 = VW::config::option_group_definition::add<bool>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_be8,"adaptive",&local_d9b);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_b10,&local_be8,&adaptive)
  ;
  std::__cxx11::string::string(local_c08,"use adaptive, individual learning rates.",&local_d9c);
  std::__cxx11::string::_M_assign((string *)(local_b10 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_168,(typed_option<bool> *)local_b10);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_168);
  std::__cxx11::string::string((string *)&local_c28,"adax",&local_d9d);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_848,&local_c28,&adax);
  std::__cxx11::string::string
            (local_c48,"use adaptive learning rates with x^2 instead of g^2x^2",&local_d9e);
  std::__cxx11::string::_M_assign((string *)(local_848 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_208,(typed_option<bool> *)local_848);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_208);
  std::__cxx11::string::string((string *)&local_c68,"invariant",&local_d9f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_8e8,&local_c68,&invariant);
  std::__cxx11::string::string(local_c88,"use safe/importance aware updates.",&local_da0);
  std::__cxx11::string::_M_assign((string *)(local_8e8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_8e8);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_2a8);
  std::__cxx11::string::string((string *)&local_ca8,"normalized",&local_da1);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7a8,&local_ca8,&normalized);
  std::__cxx11::string::string(local_cc8,"use per feature normalized updates",&local_da2);
  std::__cxx11::string::_M_assign((string *)(local_7a8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_348,(typed_option<bool> *)local_7a8);
  poVar7 = VW::config::option_group_definition::add<bool>(poVar7,&local_348);
  std::__cxx11::string::string((string *)&local_ce8,"sparse_l2",&local_da3);
  VW::config::typed_option<float>::typed_option
            (&local_488,&local_ce8,
             &(g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sparse_l2);
  ptVar8 = VW::config::typed_option<float>::default_value(&local_488,0.0);
  std::__cxx11::string::string(local_d08,"use per feature normalized updates",&local_da4);
  std::__cxx11::string::_M_assign((string *)&(ptVar8->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_3e8,ptVar8);
  poVar7 = VW::config::option_group_definition::add<float>(poVar7,&local_3e8);
  std::__cxx11::string::string((string *)&local_d28,"l1_state",&local_da5);
  VW::config::typed_option<double>::typed_option(&local_5c8,&local_d28,&all->sd->gravity);
  local_5c8.super_base_option.m_keep = all->save_resume;
  ptVar9 = VW::config::typed_option<double>::default_value(&local_5c8,0.0);
  std::__cxx11::string::string(local_d48,"use per feature normalized updates",&local_da6);
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_528,ptVar9);
  poVar7 = VW::config::option_group_definition::add<double>(poVar7,&local_528);
  std::__cxx11::string::string((string *)&local_d68,"l2_state",&local_da7);
  VW::config::typed_option<double>::typed_option(&local_708,&local_d68,&all->sd->contraction);
  local_708.super_base_option.m_keep = all->save_resume;
  ptVar9 = VW::config::typed_option<double>::default_value(&local_708,1.0);
  std::__cxx11::string::string(local_d88,"use per feature normalized updates",&local_da8);
  std::__cxx11::string::_M_assign((string *)&(ptVar9->super_base_option).m_help);
  VW::config::typed_option<double>::typed_option(&local_668,ptVar9);
  VW::config::option_group_definition::add<double>(poVar7,&local_668);
  VW::config::typed_option<double>::~typed_option(&local_668);
  std::__cxx11::string::~string(local_d88);
  VW::config::typed_option<double>::~typed_option(&local_708);
  std::__cxx11::string::~string((string *)&local_d68);
  VW::config::typed_option<double>::~typed_option(&local_528);
  std::__cxx11::string::~string(local_d48);
  VW::config::typed_option<double>::~typed_option(&local_5c8);
  std::__cxx11::string::~string((string *)&local_d28);
  VW::config::typed_option<float>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_d08);
  VW::config::typed_option<float>::~typed_option(&local_488);
  std::__cxx11::string::~string((string *)&local_ce8);
  VW::config::typed_option<bool>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_cc8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_7a8);
  std::__cxx11::string::~string((string *)&local_ca8);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_c88);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_8e8);
  std::__cxx11::string::~string((string *)&local_c68);
  VW::config::typed_option<bool>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_c48);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_848);
  std::__cxx11::string::~string((string *)&local_c28);
  VW::config::typed_option<bool>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_c08);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_b10);
  std::__cxx11::string::~string((string *)&local_be8);
  VW::config::typed_option<bool>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_bc8);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_ba8);
  (**options->_vptr_options_i)(options,&new_options);
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->all = all;
  all->normalized_sum_norm_x = 0.0;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->total_weight = 0.0;
  fVar21 = -1.0;
  if (all->adaptive != false) {
    fVar21 = all->power_t + -1.0;
  }
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_norm_power = fVar21;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->neg_power_t = -all->power_t;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->adaptive = all->adaptive;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->normalized = all->normalized_updates;
  if (0.0 < all->initial_t) {
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->all->normalized_sum_norm_x = (double)all->initial_t;
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->total_weight = (double)all->initial_t;
  }
  std::__cxx11::string::string((string *)&__msg,"feature_mask",(allocator *)local_b10);
  iVar5 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::__cxx11::string::string((string *)&__msg,"early_terminate",(allocator *)local_b10);
    ptVar10 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)&__msg);
    peVar1 = (ptVar10->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if (peVar1 == (element_type *)0x0) {
      eVar11 = 0;
    }
    else {
      eVar11 = *peVar1;
    }
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->early_stop_thres = eVar11;
    std::__cxx11::string::~string((string *)&__msg);
  }
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->initial_constant = all->initial_constant;
  if ((((sgd == true) || ((adaptive & 1U) != 0)) || ((invariant & 1U) != 0)) || (normalized == true)
     ) {
    bVar20 = all->training == false;
    bVar19 = adaptive;
    if (bVar20) {
      bVar19 = false;
    }
    all->adaptive = bVar19;
    bVar19 = invariant;
    if (bVar20) {
      bVar19 = false;
    }
    all->invariant_updates = bVar19;
    bVar19 = normalized;
    if (bVar20) {
      bVar19 = false;
    }
    all->normalized_updates = bVar19;
    std::__cxx11::string::string((string *)&__msg,"learning_rate",(allocator *)local_848);
    iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
    if ((char)iVar6 == '\0') {
      std::__cxx11::string::string((string *)local_b10,"l",(allocator *)local_8e8);
      iVar6 = (*options->_vptr_options_i[1])(options,local_b10);
      if ((char)iVar6 != '\0') {
        std::__cxx11::string::~string((string *)local_b10);
        goto LAB_001358b6;
      }
      bVar19 = all->adaptive;
      bVar20 = all->normalized_updates;
      std::__cxx11::string::~string((string *)local_b10);
      std::__cxx11::string::~string((string *)&__msg);
      if ((bVar19 != true) || ((bVar20 & 1U) == 0)) {
        all->eta = 10.0;
      }
    }
    else {
LAB_001358b6:
      std::__cxx11::string::~string((string *)&__msg);
    }
    if ((all->adaptive == false) && (all->normalized_updates == false)) {
      std::__cxx11::string::string((string *)&__msg,"initial_t",(allocator *)local_b10);
      iVar6 = (*options->_vptr_options_i[1])(options,&__msg);
      std::__cxx11::string::~string((string *)&__msg);
      if ((char)iVar6 == '\0') {
        all->sd->t = 1.0;
        all->initial_t = 1.0;
      }
      fVar21 = powf((float)all->sd->t,all->power_t);
      all->eta = fVar21 * all->eta;
    }
  }
  else {
    bVar19 = all->training;
    all->adaptive = bVar19;
    all->invariant_updates = bVar19;
    all->normalized_updates = bVar19;
  }
  if (adax == false) {
    bVar4 = (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->adax;
  }
  else {
    bVar4 = all->training;
    (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
    _M_head_impl)->adax = (bool)bVar4;
  }
  if (((bVar4 & 1) != 0) && (all->adaptive == false)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_a60,"Cannot use adax without adaptive");
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/gd.cc"
               ,0x48e,&local_b68);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  dVar22 = pow((double)all->eta_decay_rate,
               ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
  if (dVar22 < 0.0001) {
    std::operator<<(&(all->trace_message).super_ostream,
                    "Warning: the learning rate for the last pass is multiplied by: ");
    dVar22 = pow((double)all->eta_decay_rate,
                 ((double)CONCAT44(0x45300000,(int)(all->numpasses >> 0x20)) -
                 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)all->numpasses) - 4503599627370496.0));
    poVar12 = std::ostream::_M_insert<double>(dVar22);
    poVar12 = std::operator<<(poVar12," adjust --decay_learning_rate larger to avoid this.");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  if ((all->reg_mode & 1) == 0) {
    if (all->audit != false) {
      pcVar13 = predict<false,true>;
      pcVar16 = multipredict<false,true>;
      goto LAB_00135b19;
    }
    pcVar13 = predict<false,false>;
    bVar19 = all->hash_inv == false;
    if (!bVar19) {
      pcVar13 = predict<false,true>;
    }
    pcVar18 = multipredict<false,true>;
    pcVar16 = multipredict<false,false>;
  }
  else {
    if (all->audit != false) {
      pcVar16 = multipredict<true,true>;
      pcVar13 = predict<true,true>;
      goto LAB_00135b19;
    }
    pcVar13 = predict<true,false>;
    bVar19 = all->hash_inv == false;
    if (!bVar19) {
      pcVar13 = predict<true,true>;
    }
    pcVar18 = multipredict<true,true>;
    pcVar16 = multipredict<true,false>;
  }
  if (!bVar19) {
    pcVar16 = pcVar18;
  }
LAB_00135b19:
  bVar19 = (bool)((byte)iVar5 ^ 1);
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->predict = pcVar13;
  (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
  _M_head_impl)->multipredict = pcVar16;
  if ((all->power_t != 0.5) || (NAN(all->power_t))) {
    uVar14 = set_learn<false>(all,bVar19,
                              g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  else {
    uVar14 = set_learn<true>(all,bVar19,
                             g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                             super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                             super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl);
  }
  uVar14 = ceil_log_2(uVar14 - 1);
  parameters::stride_shift(&all->weights,(uint32_t)uVar14);
  puVar17 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar17 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar15 = LEARNER::init_learner<GD::gd,example,LEARNER::learner<char,char>>
                      (&g,(_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                          (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->learn,
                       (_func_void_gd_ptr_learner<char,_char>_ptr_example_ptr *)
                       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->predict,
                       1L << ((byte)*puVar17 & 0x3f));
  p_Var2 = (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
            super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.
            super__Head_base<0UL,_GD::gd_*,_false>._M_head_impl)->sensitivity;
  uVar3 = *(undefined8 *)(plVar15 + 0x18);
  *(undefined8 *)(plVar15 + 0x48) = uVar3;
  *(_func_float_gd_ptr_base_learner_ptr_example_ptr **)(plVar15 + 0x50) = p_Var2;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr_size_t_size_t_polyprediction_ptr_bool **)
   (plVar15 + 0x40) =
       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->multipredict;
  *(_func_void_gd_ptr_base_learner_ptr_example_ptr **)(plVar15 + 0x38) =
       (g._M_t.super___uniq_ptr_impl<GD::gd,_void_(*)(void_*)>._M_t.
        super__Tuple_impl<0UL,_GD::gd_*,_void_(*)(void_*)>.super__Head_base<0UL,_GD::gd_*,_false>.
       _M_head_impl)->update;
  *(code **)(plVar15 + 0x80) = save_load;
  *(undefined8 *)(plVar15 + 0x70) = uVar3;
  *(undefined8 *)(plVar15 + 0x78) = *(undefined8 *)(plVar15 + 0x20);
  *(undefined8 *)(plVar15 + 0x88) = uVar3;
  *(undefined8 *)(plVar15 + 0x90) = *(undefined8 *)(plVar15 + 0x20);
  *(code **)(plVar15 + 0x98) = end_pass;
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<GD::gd,_void_(*)(void_*)>::~unique_ptr(&g);
  return (base_learner *)plVar15;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  auto g = scoped_calloc_or_throw<gd>();

  bool sgd = false;
  bool adaptive = false;
  bool adax = false;
  bool invariant = false;
  bool normalized = false;

  option_group_definition new_options("Gradient Descent options");
  new_options.add(make_option("sgd", sgd).help("use regular stochastic gradient descent update."))
      .add(make_option("adaptive", adaptive).help("use adaptive, individual learning rates."))
      .add(make_option("adax", adax).help("use adaptive learning rates with x^2 instead of g^2x^2"))
      .add(make_option("invariant", invariant).help("use safe/importance aware updates."))
      .add(make_option("normalized", normalized).help("use per feature normalized updates"))
      .add(make_option("sparse_l2", g->sparse_l2).default_value(0.f).help("use per feature normalized updates"))
      .add(make_option("l1_state", all.sd->gravity)
               .keep(all.save_resume)
               .default_value(0.)
               .help("use per feature normalized updates"))
      .add(make_option("l2_state", all.sd->contraction)
               .keep(all.save_resume)
               .default_value(1.)
               .help("use per feature normalized updates"));
  options.add_and_parse(new_options);

  g->all = &all;
  g->all->normalized_sum_norm_x = 0;
  g->no_win_counter = 0;
  g->total_weight = 0.;
  g->neg_norm_power = (all.adaptive ? (all.power_t - 1.f) : -1.f);
  g->neg_power_t = -all.power_t;
  g->adaptive = all.adaptive;
  g->normalized = all.normalized_updates;

  if (all.initial_t > 0)  // for the normalized update: if initial_t is bigger than 1 we interpret this as if we had
                          // seen (all.initial_t) previous fake datapoints all with norm 1
  {
    g->all->normalized_sum_norm_x = all.initial_t;
    g->total_weight = all.initial_t;
  }

  bool feature_mask_off = true;
  if (options.was_supplied("feature_mask"))
    feature_mask_off = false;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    g->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  g->initial_constant = all.initial_constant;

  if (sgd || adaptive || invariant || normalized)
  {
    // nondefault
    all.adaptive = all.training && adaptive;
    all.invariant_updates = all.training && invariant;
    all.normalized_updates = all.training && normalized;

    if (!options.was_supplied("learning_rate") && !options.was_supplied("l") &&
        !(all.adaptive && all.normalized_updates))
      all.eta = 10;  // default learning rate to 10 for non default update rule

    // if not using normalized or adaptive, default initial_t to 1 instead of 0
    if (!all.adaptive && !all.normalized_updates)
    {
      if (!options.was_supplied("initial_t"))
      {
        all.sd->t = 1.f;
        all.initial_t = 1.f;
      }
      all.eta *= powf((float)(all.sd->t), all.power_t);
    }
  }
  else
  {
    all.adaptive = all.training;
    all.invariant_updates = all.training;
    all.normalized_updates = all.training;
  }

  if (adax)
    g->adax = all.training && adax;

  if (g->adax && !all.adaptive)
    THROW("Cannot use adax without adaptive");

  if (pow((double)all.eta_decay_rate, (double)all.numpasses) < 0.0001)
    all.trace_message << "Warning: the learning rate for the last pass is multiplied by: "
                      << pow((double)all.eta_decay_rate, (double)all.numpasses)
                      << " adjust --decay_learning_rate larger to avoid this." << endl;

  if (all.reg_mode % 2)
    if (all.audit || all.hash_inv)
    {
      g->predict = predict<true, true>;
      g->multipredict = multipredict<true, true>;
    }
    else
    {
      g->predict = predict<true, false>;
      g->multipredict = multipredict<true, false>;
    }
  else if (all.audit || all.hash_inv)
  {
    g->predict = predict<false, true>;
    g->multipredict = multipredict<false, true>;
  }
  else
  {
    g->predict = predict<false, false>;
    g->multipredict = multipredict<false, false>;
  }

  uint64_t stride;
  if (all.power_t == 0.5)
    stride = set_learn<true>(all, feature_mask_off, *g.get());
  else
    stride = set_learn<false>(all, feature_mask_off, *g.get());

  all.weights.stride_shift((uint32_t)ceil_log_2(stride - 1));

  gd* bare = g.get();
  learner<gd, example>& ret = init_learner(g, g->learn, bare->predict, ((uint64_t)1 << all.weights.stride_shift()));
  ret.set_sensitivity(bare->sensitivity);
  ret.set_multipredict(bare->multipredict);
  ret.set_update(bare->update);
  ret.set_save_load(save_load);
  ret.set_end_pass(end_pass);
  return make_base(ret);
}